

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

HighsBasisStatus
checkedVarHighsNonbasicStatus(HighsBasisStatus ideal_status,double lower,double upper)

{
  bool bVar1;
  char in_DIL;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  HighsBasisStatus checked_status;
  undefined1 local_19;
  
  if ((in_DIL == '\0') || (in_DIL == '\x03')) {
    bVar1 = highs_isInfinity(-in_XMM0_Qa);
    if (bVar1) {
      bVar1 = highs_isInfinity(in_XMM1_Qa);
      if (bVar1) {
        local_19 = kZero;
      }
      else {
        local_19 = kUpper;
      }
    }
    else {
      local_19 = kLower;
    }
  }
  else {
    bVar1 = highs_isInfinity(in_XMM1_Qa);
    if (bVar1) {
      bVar1 = highs_isInfinity(-in_XMM0_Qa);
      if (bVar1) {
        local_19 = kZero;
      }
      else {
        local_19 = kLower;
      }
    }
    else {
      local_19 = kUpper;
    }
  }
  return local_19;
}

Assistant:

HighsBasisStatus checkedVarHighsNonbasicStatus(
    const HighsBasisStatus ideal_status, const double lower,
    const double upper) {
  HighsBasisStatus checked_status;
  if (ideal_status == HighsBasisStatus::kLower ||
      ideal_status == HighsBasisStatus::kZero) {
    // Looking to give status LOWER or ZERO
    if (highs_isInfinity(-lower)) {
      // Lower bound is infinite
      if (highs_isInfinity(upper)) {
        // Upper bound is infinite
        checked_status = HighsBasisStatus::kZero;
      } else {
        // Upper bound is finite
        checked_status = HighsBasisStatus::kUpper;
      }
    } else {
      checked_status = HighsBasisStatus::kLower;
    }
  } else {
    // Looking to give status UPPER
    if (highs_isInfinity(upper)) {
      // Upper bound is infinite
      if (highs_isInfinity(-lower)) {
        // Lower bound is infinite
        checked_status = HighsBasisStatus::kZero;
      } else {
        // Upper bound is finite
        checked_status = HighsBasisStatus::kLower;
      }
    } else {
      checked_status = HighsBasisStatus::kUpper;
    }
  }
  return checked_status;
}